

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O3

void __thiscall Matrix<int>::transpose(Matrix<int> *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ulong cols;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  pointer piVar8;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  long lVar13;
  pointer piVar14;
  int *piVar15;
  size_type sVar16;
  undefined1 auVar17 [16];
  Matrix<int> t;
  Matrix<int> local_50;
  
  cols = *this->num_rows;
  if (cols == *this->num_cols) {
    if (cols != 0) {
      piVar8 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = this->cols_;
      piVar9 = piVar8 + sVar5;
      piVar8 = piVar8 + 1;
      uVar10 = 0;
      do {
        uVar11 = uVar10 + 1;
        if (uVar11 < cols) {
          lVar13 = 1;
          piVar14 = piVar9;
          do {
            iVar4 = piVar8[lVar13 + -1];
            piVar8[lVar13 + -1] = *piVar14;
            *piVar14 = iVar4;
            lVar1 = uVar10 + lVar13;
            lVar13 = lVar13 + 1;
            piVar14 = piVar14 + sVar5;
          } while (lVar1 + 1U < cols);
        }
        piVar8 = piVar8 + sVar5 + 1;
        piVar9 = piVar9 + sVar5 + 1;
        uVar10 = uVar11;
      } while (uVar11 != cols);
    }
  }
  else {
    Matrix(&local_50,*this->num_cols,cols);
    piVar9 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = *this->num_rows;
    if (sVar5 != 0) {
      sVar6 = this->cols_;
      sVar7 = *this->num_cols;
      sVar12 = 0;
      piVar8 = local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (sVar7 != 0) {
          sVar16 = 0;
          piVar15 = piVar8;
          do {
            *piVar15 = piVar9[sVar16];
            sVar16 = sVar16 + 1;
            piVar15 = piVar15 + local_50.cols_;
          } while (sVar7 != sVar16);
        }
        sVar12 = sVar12 + 1;
        piVar9 = piVar9 + sVar6;
        piVar8 = piVar8 + 1;
      } while (sVar12 != sVar5);
      piVar9 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    piVar8 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar14 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (piVar9 != (pointer)0x0) {
      local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = piVar9;
      local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar8;
      local_50.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar14;
      operator_delete(piVar9,(long)piVar14 - (long)piVar9);
    }
  }
  uVar2 = this->rows_;
  uVar3 = this->cols_;
  auVar17._8_4_ = (int)uVar2;
  auVar17._0_8_ = uVar3;
  auVar17._12_4_ = (int)((ulong)uVar2 >> 0x20);
  this->rows_ = uVar3;
  this->cols_ = auVar17._8_8_;
  return;
}

Assistant:

void transpose(){
    // if matrix is square, no extra memory is needed to build its transpose
    if (num_rows == num_cols){
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {i + 1}; j < num_cols; j++){
          std::swap(at(i, j), at(j, i));
        }
      }
    }
    // if matrix is not square, some extra memory is needed to build
    // its transpose
    else{
      // auxiliar memory to temporarily hold the transpose
      Matrix<Type> t {num_cols, num_rows};
      // builds transpose
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {0}; j < num_cols; j++){
          t.at(j, i) = at(i, j);
        }
      }
      // exchanges matrix data with t data, which is about to die
      std::swap(data_, t.data_);
    }
    // exchanges number of rows and columns
    std::swap(rows_, cols_);
  }